

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# new_meshfile_operations.cpp
# Opt level: O0

int MSH::check_read_state(fstream *infile)

{
  ulong uVar1;
  ostream *this;
  bool bVar2;
  fstream *infile_local;
  
  uVar1 = std::ios::bad();
  bVar2 = (uVar1 & 1) != 0;
  if (bVar2) {
    this = std::operator<<((ostream *)&std::cout,"Error: Reached bad read state of msh file.");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  infile_local._4_4_ = (uint)bVar2;
  return infile_local._4_4_;
}

Assistant:

int MSH::check_read_state(std::fstream &infile)
{
    if (infile.bad())
    {
        std::cout << "Error: Reached bad read state of msh file." << std::endl;
        return EXIT_FAILURE;
    }
    else
        return EXIT_SUCCESS;
    return EXIT_FAILURE;
}